

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3ExprCheckDepth(Fts3Expr *p,int nMaxDepth)

{
  int iVar1;
  
  while( true ) {
    if (p == (Fts3Expr *)0x0) {
      return 0;
    }
    if (nMaxDepth < 0) break;
    nMaxDepth = nMaxDepth + -1;
    iVar1 = fts3ExprCheckDepth(p->pLeft,nMaxDepth);
    if (iVar1 != 0) {
      return iVar1;
    }
    p = p->pRight;
  }
  return 0x12;
}

Assistant:

static int fts3ExprCheckDepth(Fts3Expr *p, int nMaxDepth){
  int rc = SQLITE_OK;
  if( p ){
    if( nMaxDepth<0 ){
      rc = SQLITE_TOOBIG;
    }else{
      rc = fts3ExprCheckDepth(p->pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprCheckDepth(p->pRight, nMaxDepth-1);
      }
    }
  }
  return rc;
}